

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractLoggingDevice.cpp
# Opt level: O0

void __thiscall
SLogLib::AbstractLoggingDevice::SetBufferedMessagesCount(AbstractLoggingDevice *this,size_t x)

{
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> _lock;
  size_t x_local;
  AbstractLoggingDevice *this_local;
  
  _lock._M_device = (mutex_type *)x;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,&this->mPriv->mBufferedMessagesMutex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->mPriv->mBufferedMessages,(size_type)_lock._M_device);
  this->mPriv->mBufferedMessagesCount = (size_t)_lock._M_device;
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void AbstractLoggingDevice::SetBufferedMessagesCount(size_t x)
{
	std::lock_guard<std::recursive_mutex> _lock(mPriv->mBufferedMessagesMutex);
	mPriv->mBufferedMessages.reserve(x);
	mPriv->mBufferedMessagesCount = x;
}